

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void EmitMethodFld(bool isRoot,bool isScoped,RegSlot location,RegSlot callObjLocation,
                  PropertyId propertyId,ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo,
                  bool registerCacheIdForCall)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  OpCode op;
  undefined7 in_register_00000039;
  
  if ((int)CONCAT71(in_register_00000039,isRoot) == 0) {
    op = LdMethodFld;
    if (funcInfo->frameObjRegister == callObjLocation) {
      op = LdLocalMethodFld;
    }
  }
  else {
    op = LdRootMethodFld;
    if (isScoped) {
      op = ScopedLdMethodFld;
    }
  }
  if (isRoot && !isScoped) {
    uVar3 = FuncInfo::FindOrAddRootObjectInlineCacheId(funcInfo,propertyId,true,false);
    Js::ByteCodeWriter::PatchableRootProperty
              (&byteCodeGenerator->m_writer,op,location,uVar3,true,false,registerCacheIdForCall);
  }
  else {
    if ((~isScoped & isRoot & callObjLocation != 0xfffffffd) == 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x1eca,
                         "(isScoped || !isRoot || callObjLocation == ByteCodeGenerator::RootObjectRegister)"
                         ,
                         "isScoped || !isRoot || callObjLocation == ByteCodeGenerator::RootObjectRegister"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    uVar3 = FuncInfo::FindOrAddInlineCacheId(funcInfo,callObjLocation,propertyId,true,false);
    if (funcInfo->frameObjRegister == callObjLocation) {
      Js::ByteCodeWriter::ElementP
                (&byteCodeGenerator->m_writer,op,location,uVar3,false,registerCacheIdForCall);
      return;
    }
    Js::ByteCodeWriter::PatchableProperty
              (&byteCodeGenerator->m_writer,op,location,callObjLocation,uVar3,false,
               registerCacheIdForCall);
  }
  return;
}

Assistant:

void EmitMethodFld(bool isRoot, bool isScoped, Js::RegSlot location, Js::RegSlot callObjLocation, Js::PropertyId propertyId, ByteCodeGenerator *byteCodeGenerator, FuncInfo *funcInfo, bool registerCacheIdForCall = true)
{
    Js::OpCode opcode;
    if (!isRoot)
    {
        if (callObjLocation == funcInfo->frameObjRegister)
        {
            opcode = Js::OpCode::LdLocalMethodFld;
        }
        else
        {
            opcode = Js::OpCode::LdMethodFld;
        }
    }
    else if (isScoped)
    {
        opcode = Js::OpCode::ScopedLdMethodFld;
    }
    else
    {
        opcode = Js::OpCode::LdRootMethodFld;
    }

    if (isScoped || !isRoot)
    {
        Assert(isScoped || !isRoot || callObjLocation == ByteCodeGenerator::RootObjectRegister);
        uint cacheId = funcInfo->FindOrAddInlineCacheId(callObjLocation, propertyId, true, false);
        if (callObjLocation == funcInfo->frameObjRegister)
        {
            byteCodeGenerator->Writer()->ElementP(opcode, location, cacheId, false /*isCtor*/, registerCacheIdForCall);
        }
        else
        {
            byteCodeGenerator->Writer()->PatchableProperty(opcode, location, callObjLocation, cacheId, false /*isCtor*/, registerCacheIdForCall);
        }
    }
    else
    {
        uint cacheId = funcInfo->FindOrAddRootObjectInlineCacheId(propertyId, true, false);
        byteCodeGenerator->Writer()->PatchableRootProperty(opcode, location, cacheId, true, false, registerCacheIdForCall);
    }
}